

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_superblock.c
# Opt level: O2

size_t ZSTD_compressSuperBlock
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize,uint lastBlock
                 )

{
  seqDef *seq;
  bool bVar1;
  bool bVar2;
  ZSTD_entropyCTablesMetadata_t *workspace;
  void *pvVar3;
  uint uVar4;
  size_t err_code_1;
  byte *pbVar5;
  ZSTD_sequenceLength ZVar6;
  BYTE *pBVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  long lVar11;
  byte *pbVar12;
  byte *pbVar13;
  int iVar14;
  int iVar15;
  size_t __n;
  U32 *pUVar16;
  size_t err_code;
  seqDef *psVar17;
  uint uVar18;
  ulong uVar19;
  ZSTD_entropyCTablesMetadata_t *entropyMetadata_00;
  undefined4 in_register_0000008c;
  long lVar20;
  ulong uVar21;
  seqStore_t *seqStorePtr;
  size_t sVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  size_t in_stack_fffffffffffffd78;
  BYTE *local_270;
  BYTE *local_268;
  undefined8 local_260;
  U32 local_258 [2];
  byte *local_250;
  seqDef *local_248;
  seqDef *sstart;
  ulong local_238;
  ZSTD_compressedBlockState_t *local_230;
  long local_228;
  ZSTD_entropyCTablesMetadata_t *local_220;
  byte *local_218;
  BYTE *local_210;
  BYTE *local_208;
  BYTE *local_200;
  ZSTD_entropyCTablesMetadata_t *local_1f8;
  ZSTD_compressedBlockState_t *local_1f0;
  BYTE *local_1e8;
  undefined8 local_1e0;
  ZSTD_entropyCTablesMetadata_t *local_1d8;
  FSE_CTable *local_1d0;
  ZSTD_entropyCTablesMetadata_t *local_1c8;
  BYTE *local_1c0;
  seqDef *local_1b8;
  BYTE *local_1b0;
  void *local_1a8;
  ulong local_1a0;
  ZSTD_CCtx *local_198;
  seqDef *local_190;
  seqStore_t *local_188;
  seqDef *local_180;
  ulong local_178;
  BYTE *local_170;
  ZSTD_entropyCTablesMetadata_t entropyMetadata;
  
  local_1e0 = CONCAT44(in_register_0000008c,lastBlock);
  seqStorePtr = &zc->seqStore;
  entropyMetadata_00 = &entropyMetadata;
  pbVar5 = (byte *)ZSTD_buildBlockEntropyStats
                             (seqStorePtr,&((zc->blockState).prevCBlock)->entropy,
                              &((zc->blockState).nextCBlock)->entropy,&zc->appliedParams,
                              entropyMetadata_00,zc->entropyWorkspace,0x19d8);
  if (pbVar5 < (byte *)0xffffffffffffff89) {
    local_1f0 = (zc->blockState).prevCBlock;
    local_230 = (zc->blockState).nextCBlock;
    local_1a0 = (ulong)(uint)zc->bmi2;
    local_1f8 = (ZSTD_entropyCTablesMetadata_t *)zc->entropyWorkspace;
    psVar17 = (zc->seqStore).sequencesStart;
    local_1b8 = (zc->seqStore).sequences;
    local_268 = (zc->seqStore).litStart;
    local_1c0 = (zc->seqStore).lit;
    local_1b0 = (BYTE *)(srcSize + (long)src);
    local_228 = dstCapacity + (long)dst;
    local_200 = (zc->seqStore).llCode;
    local_208 = (zc->seqStore).mlCode;
    local_210 = (zc->seqStore).ofCode;
    bVar23 = entropyMetadata.hufMetadata.hType == set_compressed;
    local_170 = (BYTE *)(zc->appliedParams).targetCBlockSize;
    local_180 = local_1b8 + -1;
    local_1c8 = (ZSTD_entropyCTablesMetadata_t *)&(local_230->entropy).fse;
    local_1d0 = (local_230->entropy).fse.litlengthCTable;
    local_1d8 = (ZSTD_entropyCTablesMetadata_t *)(local_230->entropy).fse.matchlengthCTable;
    bVar2 = true;
    uVar21 = 0;
    local_270 = (BYTE *)0x0;
    local_250 = (byte *)dst;
    local_248 = psVar17;
    sstart = psVar17;
    local_1e8 = (BYTE *)src;
    local_1a8 = dst;
    local_198 = zc;
    local_188 = seqStorePtr;
    do {
      if (psVar17 == local_1b8) {
        bVar24 = true;
        local_270 = local_1c0 + -(long)local_268;
      }
      else {
        seq = sstart + uVar21;
        ZVar6 = ZSTD_getSequenceLength(seqStorePtr,seq);
        pBVar7 = local_270 + ((ulong)ZVar6 & 0xffffffff);
        uVar21 = uVar21 + 1;
        bVar24 = seq == local_180;
        local_270 = local_1c0 + -(long)local_268;
        if (!bVar24) {
          local_270 = pBVar7;
        }
      }
      local_260 = CONCAT44(local_260._4_4_,0xff);
      pBVar7 = local_270;
      if (entropyMetadata.hufMetadata.hType - set_compressed < 2) {
        entropyMetadata_00 = local_1f8;
        sVar22 = HIST_count_wksp((uint *)local_1f8,(uint *)&local_260,local_268,(size_t)local_270,
                                 local_1f8,0x19d8);
        if (sVar22 < 0xffffffffffffff89) {
          sVar8 = HUF_estimateCompressedSize
                            ((HUF_CElt *)local_230,(uint *)local_1f8,(uint)local_260);
          sVar22 = entropyMetadata.hufMetadata.hufDesSize;
          if (!bVar23) {
            sVar22 = 0;
          }
          pBVar7 = (BYTE *)(sVar8 + sVar22 + 3);
        }
      }
      else if (entropyMetadata.hufMetadata.hType != set_basic) {
        if (entropyMetadata.hufMetadata.hType == set_rle) {
          pBVar7 = &DAT_00000001;
        }
        else {
          pBVar7 = (BYTE *)0x0;
        }
      }
      workspace = local_1f8;
      lVar11 = 3;
      if (uVar21 != 0) {
        sVar8 = ZSTD_estimateSubBlockSize_symbolType
                          (entropyMetadata.fseMetadata.ofType,local_210,0x1f,uVar21,
                           (FSE_CTable *)local_1c8,(U32 *)0x0,OF_defaultNorm,5,0x1c,local_1f8,
                           in_stack_fffffffffffffd78);
        sVar9 = ZSTD_estimateSubBlockSize_symbolType
                          (entropyMetadata.fseMetadata.llType,local_200,0x23,uVar21,local_1d0,
                           LL_bits,LL_defaultNorm,6,0x23,workspace,in_stack_fffffffffffffd78);
        entropyMetadata_00 = local_1d8;
        sVar10 = ZSTD_estimateSubBlockSize_symbolType
                           (entropyMetadata.fseMetadata.mlType,local_208,0x34,uVar21,
                            (FSE_CTable *)local_1d8,ML_bits,ML_defaultNorm,6,0x34,workspace,
                            in_stack_fffffffffffffd78);
        sVar22 = 0;
        if (bVar2) {
          sVar22 = entropyMetadata.fseMetadata.fseTablesSize;
        }
        lVar11 = sVar22 + sVar8 + sVar9 + sVar10 + 3;
        seqStorePtr = local_188;
        psVar17 = local_248;
      }
      if ((~bVar24 & pBVar7 + lVar11 + 3 <= local_170) == 0) {
        local_190 = sstart + uVar21;
        lVar20 = 0;
        psVar17 = sstart;
        local_178 = uVar21;
        for (lVar11 = uVar21 * 8; uVar21 = local_178, 0 < lVar11; lVar11 = lVar11 + -8) {
          ZVar6 = ZSTD_getSequenceLength(seqStorePtr,psVar17);
          lVar20 = lVar20 + ((ulong)ZVar6 >> 0x20);
          psVar17 = psVar17 + 1;
        }
        bVar25 = (int)local_1e0 != 0;
        pBVar7 = (BYTE *)CONCAT71((int7)((ulong)entropyMetadata_00 >> 8),bVar25);
        pbVar5 = local_250 + 3;
        sVar22 = (local_228 - (long)local_250) - 3;
        lVar11 = 0;
        if (bVar23) {
          lVar11 = 200;
        }
        uVar19 = 3;
        if (bVar23) {
          uVar19 = (ulong)entropyMetadata.hufMetadata.hType;
        }
        lVar11 = (ulong)((BYTE *)(0x4000 - lVar11) <= local_270) -
                 (ulong)(local_270 < (BYTE *)(0x400 - lVar11));
        if (local_270 == (BYTE *)0x0) {
LAB_00579884:
          pbVar12 = (byte *)ZSTD_noCompressLiterals(pbVar5,sVar22,local_268,(size_t)local_270);
LAB_0057989b:
          entropyMetadata_00 =
               (ZSTD_entropyCTablesMetadata_t *)CONCAT71((int7)((ulong)pBVar7 >> 8),1);
        }
        else {
          if (entropyMetadata.hufMetadata.hType == set_rle) {
            pbVar12 = (byte *)ZSTD_compressRleLiteralsBlock
                                        (pbVar5,sVar22,local_268,(size_t)local_270);
            goto LAB_0057989b;
          }
          if (entropyMetadata.hufMetadata.hType == set_basic) goto LAB_00579884;
          pbVar12 = local_250 + lVar11 + 7;
          local_238 = uVar19;
          local_218 = pbVar5;
          if (entropyMetadata.hufMetadata.hType == set_compressed && bVar23) {
            memcpy(pbVar12,entropyMetadata.hufMetadata.hufDesBuffer,
                   entropyMetadata.hufMetadata.hufDesSize);
            pbVar12 = pbVar12 + entropyMetadata.hufMetadata.hufDesSize;
            local_220 = (ZSTD_entropyCTablesMetadata_t *)entropyMetadata.hufMetadata.hufDesSize;
          }
          else {
            local_220 = (ZSTD_entropyCTablesMetadata_t *)0x0;
          }
          uVar19 = lVar11 + 4;
          if (uVar19 == 3) {
            sVar8 = HUF_compress1X_usingCTable
                              (pbVar12,local_228 - (long)pbVar12,local_268,(size_t)local_270,
                               (HUF_CElt *)local_230);
          }
          else {
            sVar8 = HUF_compress4X_usingCTable
                              (pbVar12,local_228 - (long)pbVar12,local_268,(size_t)local_270,
                               (HUF_CElt *)local_230);
          }
          entropyMetadata_00 = local_220;
          psVar17 = local_248;
          if (0xffffffffffffff87 < sVar8 - 1) goto LAB_00579b50;
          pBVar7 = (local_220->hufMetadata).hufDesBuffer + (sVar8 - 4);
          pbVar5 = local_218;
          if (((!bVar23) && (local_270 <= pBVar7)) ||
             (uVar19 < ((ulong)((BYTE *)0x3ff < pBVar7) - (ulong)(pBVar7 < (BYTE *)0x4000)) + 4))
          goto LAB_00579884;
          iVar14 = (int)local_270 * 0x10;
          uVar18 = (uint)pBVar7;
          iVar15 = (int)local_238;
          if (uVar19 == 5) {
            *(uint *)(local_250 + 3) = uVar18 * 0x400000 + iVar15 + iVar14 + 0xc;
            local_250[7] = (byte)(uVar18 >> 10);
          }
          else if (uVar19 == 4) {
            *(uint *)local_218 = uVar18 * 0x40000 + iVar15 + iVar14 + 8;
          }
          else {
            iVar14 = uVar18 * 0x4000 + iVar15 + iVar14;
            *(short *)(local_250 + 3) = (short)iVar14;
            local_250[5] = (byte)((uint)iVar14 >> 0x10);
          }
          pbVar12 = pbVar12 + (sVar8 - (long)local_218);
          entropyMetadata_00 = (ZSTD_entropyCTablesMetadata_t *)0x0;
        }
        if ((byte *)0xffffffffffffff88 < pbVar12) {
          return (size_t)pbVar12;
        }
        psVar17 = local_248;
        if (pbVar12 != (byte *)0x0) {
          pbVar5 = pbVar5 + (long)pbVar12;
          uVar18 = (local_198->appliedParams).cParams.windowLog;
          if (local_228 - (long)pbVar5 < 4) {
            return (size_t)(byte *)0xffffffffffffffba;
          }
          if (uVar21 < 0x7f) {
            *pbVar5 = (byte)uVar21;
            if (uVar21 != 0) {
              local_220 = (ZSTD_entropyCTablesMetadata_t *)(pbVar5 + 1);
              goto LAB_00579980;
            }
            bVar1 = true;
            pbVar12 = &DAT_00000001;
LAB_00579b6d:
            pbVar13 = pbVar5 + (long)pbVar12 + -(long)local_250;
            iVar14 = ((byte)(bVar25 & bVar24) | 0xffffffec) + (int)pbVar13 * 8;
            *(short *)local_250 = (short)iVar14;
            local_250[2] = (byte)((uint)iVar14 >> 0x10);
            if ((byte *)0xffffffffffffff88 < pbVar13) {
              return (size_t)pbVar13;
            }
            psVar17 = local_248;
            if ((pbVar13 != (byte *)0x0) && (pbVar13 < local_270 + lVar20)) {
              local_1e8 = local_1e8 + (long)(local_270 + lVar20);
              local_268 = local_268 + (long)local_270;
              local_200 = local_200 + uVar21;
              local_208 = local_208 + uVar21;
              local_210 = local_210 + uVar21;
              if ((char)entropyMetadata_00 == '\0') {
                bVar23 = false;
              }
              if (!bVar1) {
                bVar2 = false;
              }
              uVar21 = 0;
              local_270 = (BYTE *)0x0;
              sstart = local_190;
              local_250 = pbVar5 + (long)pbVar12;
            }
          }
          else {
            if (uVar21 < 0x7f00) {
              *pbVar5 = (byte)(uVar21 >> 8) | 0x80;
              pbVar5[1] = (byte)uVar21;
              local_220 = (ZSTD_entropyCTablesMetadata_t *)(pbVar5 + 2);
            }
            else {
              *pbVar5 = 0xff;
              *(short *)(pbVar5 + 1) = (short)uVar21 + -0x7f00;
              local_220 = (ZSTD_entropyCTablesMetadata_t *)(pbVar5 + 3);
            }
LAB_00579980:
            local_238 = CONCAT44(local_238._4_4_,(int)entropyMetadata_00);
            pbVar12 = (byte *)((long)&(local_220->hufMetadata).hType + 1);
            local_218 = pbVar5;
            if (bVar2) {
              *(char *)&(local_220->hufMetadata).hType =
                   (char)(entropyMetadata.fseMetadata.ofType << 4) +
                   (char)(entropyMetadata.fseMetadata.llType << 6) +
                   (char)entropyMetadata.fseMetadata.mlType * '\x04';
              memcpy(pbVar12,entropyMetadata.fseMetadata.fseTablesBuffer,
                     entropyMetadata.fseMetadata.fseTablesSize);
              pbVar12 = pbVar12 + entropyMetadata.fseMetadata.fseTablesSize;
            }
            else {
              *(undefined1 *)&(local_220->hufMetadata).hType = 0xfc;
            }
            entropyMetadata_00 = local_1c8;
            pbVar5 = (byte *)ZSTD_encodeSequences
                                       (pbVar12,local_228 - (long)pbVar12,(FSE_CTable *)local_1d8,
                                        local_208,(FSE_CTable *)local_1c8,local_210,local_1d0,
                                        local_200,sstart,uVar21,(uint)(0x39 < uVar18),(int)local_1a0
                                       );
            if ((byte *)0xffffffffffffff88 < pbVar5) {
              return (size_t)pbVar5;
            }
            psVar17 = local_248;
            if ((((!bVar2) || (entropyMetadata.fseMetadata.lastCountSize == 0)) ||
                ((byte *)0x3 < pbVar5 + entropyMetadata.fseMetadata.lastCountSize)) &&
               (3 < (long)(pbVar12 + (long)pbVar5) - (long)local_220)) {
              pbVar12 = pbVar12 + (long)pbVar5 + -(long)local_218;
              if ((byte *)0xffffffffffffff88 < pbVar12) {
                return (size_t)pbVar12;
              }
              if (pbVar12 != (byte *)0x0) {
                bVar1 = false;
                entropyMetadata_00 = (ZSTD_entropyCTablesMetadata_t *)(local_238 & 0xffffffff);
                pbVar5 = local_218;
                goto LAB_00579b6d;
              }
            }
          }
        }
      }
LAB_00579b50:
    } while (bVar24 == false);
    if (bVar23) {
      memcpy(local_230,local_1f0,0x404);
    }
    pvVar3 = local_1a8;
    pbVar5 = local_250;
    if ((bVar2) &&
       (((entropyMetadata.fseMetadata.llType - set_rle < 2 ||
         (entropyMetadata.fseMetadata.mlType - set_rle < 2)) ||
        (0xfffffffd < entropyMetadata.fseMetadata.ofType - set_repeat)))) {
      pbVar5 = (byte *)0x0;
    }
    else {
      if (local_1e8 < local_1b0) {
        __n = (long)local_1b0 - (long)local_1e8;
        pbVar12 = (byte *)(__n + 3);
        if ((undefined1 *)(local_228 - (long)local_250) < pbVar12) {
          return (size_t)(byte *)0xffffffffffffffba;
        }
        iVar14 = (int)local_1e0 + (int)__n * 8;
        *(short *)local_250 = (short)iVar14;
        local_250[2] = (byte)((uint)iVar14 >> 0x10);
        memcpy(local_250 + 3,local_1e8,__n);
        if ((byte *)0xffffffffffffff88 < pbVar12) {
          return (size_t)pbVar12;
        }
        pbVar5 = pbVar5 + (long)pbVar12;
        if (sstart < local_1b8) {
          local_258[0] = local_1f0->rep[2];
          local_260 = *(ulong *)local_1f0->rep;
          for (; psVar17 < sstart; psVar17 = psVar17 + 1) {
            uVar18 = psVar17->offset - 1;
            pUVar16 = (U32 *)((long)&local_260 + 4);
            if (uVar18 < 3) {
              ZVar6 = ZSTD_getSequenceLength(seqStorePtr,psVar17);
              uVar18 = uVar18 + (ZVar6.litLength == 0);
              if (uVar18 == 0) {
                uVar21 = local_260 >> 0x20;
                pUVar16 = local_258;
              }
              else {
                if (uVar18 == 3) {
                  uVar4 = (uint)local_260 - 1;
                }
                else {
                  uVar4 = local_258[(ulong)uVar18 - 2];
                }
                uVar21 = local_260 & 0xffffffff;
                local_260 = (ulong)uVar4;
                if (uVar18 == 1) {
                  pUVar16 = local_258;
                }
              }
            }
            else {
              uVar21 = local_260 & 0xffffffff;
              local_260 = (ulong)(psVar17->offset - 3);
            }
            local_260 = local_260 & 0xffffffff | uVar21 << 0x20;
            local_258[0] = *pUVar16;
          }
          local_230->rep[2] = local_258[0];
          *(ulong *)local_230->rep = local_260;
        }
      }
      pbVar5 = pbVar5 + -(long)pvVar3;
    }
  }
  return (size_t)pbVar5;
}

Assistant:

size_t ZSTD_compressSuperBlock(ZSTD_CCtx* zc,
                               void* dst, size_t dstCapacity,
                               void const* src, size_t srcSize,
                               unsigned lastBlock) {
    ZSTD_entropyCTablesMetadata_t entropyMetadata;

    FORWARD_IF_ERROR(ZSTD_buildBlockEntropyStats(&zc->seqStore,
          &zc->blockState.prevCBlock->entropy,
          &zc->blockState.nextCBlock->entropy,
          &zc->appliedParams,
          &entropyMetadata,
          zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */), "");

    return ZSTD_compressSubBlock_multi(&zc->seqStore,
            zc->blockState.prevCBlock,
            zc->blockState.nextCBlock,
            &entropyMetadata,
            &zc->appliedParams,
            dst, dstCapacity,
            src, srcSize,
            zc->bmi2, lastBlock,
            zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */);
}